

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>::SetAttributes
          (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *this,
          DynamicObject *instance,PropertyId propertyId,PropertyAttributes attributes)

{
  byte bVar1;
  Type *pTVar2;
  JavascriptLibrary *pJVar3;
  ScriptContext *scriptContext;
  code *pcVar4;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *this_00;
  bool bVar5;
  PropertyId propertyId_00;
  uint32 index;
  BOOL BVar6;
  undefined4 *puVar7;
  PropertyRecord *local_48;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *local_40;
  int i;
  
  while (bVar1 = (this->super_DynamicTypeHandler).flags, (bVar1 & 4) != 0) {
    this = ConvertToNonSharedSimpleDictionaryType(this,instance);
  }
  pTVar2 = (instance->super_RecyclableObject).type.ptr;
  if (*(char *)&pTVar2[1].javascriptLibrary.ptr == '\x01') {
    if (((bVar1 & 0x10) != 0) || (*(char *)((long)&pTVar2[1].javascriptLibrary.ptr + 1) == '\x01'))
    {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0xa1a,
                                  "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())",
                                  "!GetIsShared() && !instance->GetDynamicType()->GetIsShared()");
      if (!bVar5) goto LAB_00dec780;
      *puVar7 = 0;
    }
    DynamicObject::ChangeType(instance);
  }
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0xa21,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar5) goto LAB_00dec780;
    *puVar7 = 0;
  }
  local_48 = ScriptContext::GetPropertyName
                       ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                        super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
  bVar5 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_48,
                     (SimpleDictionaryPropertyDescriptor<int> **)&i,(int *)&local_40);
  if (bVar5) {
    if ((attributes & 0x10) != 0) {
      if ((_i->Attributes & 0x10) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0xa27,"(!(descriptor->Attributes & 0x10))",
                                    "!(descriptor->Attributes & PropertyLetConstGlobal)");
        if (!bVar5) goto LAB_00dec780;
        *puVar7 = 0;
      }
      Throw::NotImplemented();
    }
    if ((_i->Attributes & 0x10) != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0xa2f,"(false)","false");
      if (!bVar5) {
LAB_00dec780:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar7 = 0;
    }
    BVar6 = 0;
    if ((_i->Attributes & 8) == 0) {
      _i->Attributes = attributes & 7 | _i->Attributes & 0xf0;
      if ((attributes & 1) != 0) {
        DynamicObject::SetHasNoEnumerableProperties(instance,false);
      }
      pJVar3 = (((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
      Memory::Recycler::WBSetBit((char *)&local_40);
      local_40 = &pJVar3->typesWithOnlyWritablePropertyProtoChain;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_40);
      this_00 = local_40;
      if ((_i->Attributes & 4) == 0) {
        scriptContext = (pJVar3->super_JavascriptLibraryBase).scriptContext.ptr;
        DynamicTypeHandler::SetHasOnlyWritableDataProperties(&this->super_DynamicTypeHandler,false);
        if (((this->super_DynamicTypeHandler).flags & 0x20) != 0) {
          propertyId_00 = DynamicTypeHandler::TMapKey_GetPropertyId(scriptContext,propertyId);
          ScriptContext::InvalidateStoreFieldCaches(scriptContext,propertyId_00);
          PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear(this_00);
        }
      }
      BVar6 = 1;
    }
  }
  else {
    bVar5 = DynamicObject::HasObjectArray(instance);
    BVar6 = 0;
    if ((bVar5) && (local_48->isNumeric == true)) {
      index = PropertyRecord::GetNumericValue(local_48);
      BVar6 = DynamicTypeHandler::SetItemAttributes
                        (&this->super_DynamicTypeHandler,instance,index,attributes);
    }
  }
  return BVar6;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetAttributes(DynamicObject* instance, PropertyId propertyId, PropertyAttributes attributes)
    {
        if (!GetIsLocked())
        {
            if (instance->GetDynamicType()->GetIsLocked())
            {
                Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                instance->ChangeType();
            }

            SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
            Assert(propertyId != Constants::NoProperty);
            PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
            if (propertyMap->TryGetReference(propertyRecord, &descriptor))
            {
                if (attributes & PropertyLetConstGlobal)
                {
                    Assert(!(descriptor->Attributes & PropertyLetConstGlobal));
                    // Need to implement type transition to DictionaryTypeHandler in the case of
                    // shadowing a var or global property with a let in a new script body.
                    Throw::NotImplemented();
                }
                if (descriptor->Attributes & PropertyLetConstGlobal)
                {
                    Assert(!(attributes & PropertyLetConstGlobal));
                    Assert(false);
                }

                if (descriptor->Attributes & PropertyDeleted)
                {
                    return false;
                }

                descriptor->Attributes = (descriptor->Attributes & ~PropertyDynamicTypeDefaults) | (attributes & PropertyDynamicTypeDefaults);

                if (attributes & PropertyEnumerable)
                {
                    instance->SetHasNoEnumerableProperties(false);
                }

                JavascriptLibrary * library = instance->GetLibrary();
                library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, descriptor->Attributes, propertyId, library->GetScriptContext());

                return true;
            }

            // Check numeric propertyRecord only if objectArray available
            if (instance->HasObjectArray() && propertyRecord->IsNumeric())
            {
                return SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetItemAttributes(instance, propertyRecord->GetNumericValue(), attributes);
            }
        }
        else
        {
            return ConvertToNonSharedSimpleDictionaryType(instance)->SetAttributes(instance, propertyId, attributes);
        }
        return false;
    }